

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O0

uint32_t icu_63::CollationFastLatin::getTertiaries
                   (uint32_t variableTop,UBool withCaseBits,uint32_t pair)

{
  uint32_t ce_1;
  uint32_t ce;
  uint32_t pair_local;
  UBool withCaseBits_local;
  uint32_t variableTop_local;
  
  if (pair < 0x10000) {
    if (pair < 0x1000) {
      if (variableTop < pair) {
        ce_1 = (pair & 7) + 0x20;
        if (withCaseBits != '\0') {
          ce_1 = ce_1 | 8;
        }
      }
      else {
        ce_1 = pair;
        if (0xbff < pair) {
          ce_1 = 0;
        }
      }
    }
    else if (withCaseBits == '\0') {
      ce_1 = (pair & 7) + 0x20;
      if (0x17f < (pair & 0x3e0)) {
        ce_1 = ce_1 | 0x200000;
      }
    }
    else {
      ce_1 = (pair & 0x1f) + 0x20;
      if (0x17f < (pair & 0x3e0)) {
        ce_1 = ce_1 | 0x280000;
      }
    }
  }
  else if ((pair & 0xffff) < 0x1000) {
    if (variableTop < (pair & 0xffff)) {
      ce_1 = (pair & 0x70007) + 0x200020;
      if (withCaseBits != '\0') {
        ce_1 = ce_1 | 0x80008;
      }
    }
    else {
      ce_1 = 0;
    }
  }
  else {
    if (withCaseBits == '\0') {
      ce_1 = pair & 0x70007;
    }
    else {
      ce_1 = pair & 0x1f001f;
    }
    ce_1 = ce_1 + 0x200020;
  }
  return ce_1;
}

Assistant:

uint32_t
CollationFastLatin::getTertiaries(uint32_t variableTop, UBool withCaseBits, uint32_t pair) {
    if(pair <= 0xffff) {
        // one mini CE
        if(pair >= MIN_SHORT) {
            // A high secondary weight means we really have two CEs,
            // a primary CE and a secondary CE.
            uint32_t ce = pair;
            if(withCaseBits) {
                pair = (pair & CASE_AND_TERTIARY_MASK) + TER_OFFSET;
                if((ce & SECONDARY_MASK) >= MIN_SEC_HIGH) {
                    pair |= (LOWER_CASE | COMMON_TER_PLUS_OFFSET) << 16;
                }
            } else {
                pair = (pair & TERTIARY_MASK) + TER_OFFSET;
                if((ce & SECONDARY_MASK) >= MIN_SEC_HIGH) {
                    pair |= COMMON_TER_PLUS_OFFSET << 16;
                }
            }
        } else if(pair > variableTop) {
            pair = (pair & TERTIARY_MASK) + TER_OFFSET;
            if(withCaseBits) {
                pair |= LOWER_CASE;
            }
        } else if(pair >= MIN_LONG) {
            pair = 0;  // variable
        }
        // else special mini CE
    } else {
        // two mini CEs, same primary groups, neither expands like above
        uint32_t ce = pair & 0xffff;
        if(ce >= MIN_SHORT) {
            if(withCaseBits) {
                pair &= TWO_CASES_MASK | TWO_TERTIARIES_MASK;
            } else {
                pair &= TWO_TERTIARIES_MASK;
            }
            pair += TWO_TER_OFFSETS;
        } else if(ce > variableTop) {
            pair = (pair & TWO_TERTIARIES_MASK) + TWO_TER_OFFSETS;
            if(withCaseBits) {
                pair |= TWO_LOWER_CASES;
            }
        } else {
            U_ASSERT(ce >= MIN_LONG);
            pair = 0;  // variable
        }
    }
    return pair;
}